

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O1

Pipeline * __thiscall
n_e_s::core::Mos6502::create_sre_instruction
          (Pipeline *__return_storage_ptr__,Mos6502 *this,Opcode opcode)

{
  MemoryAccess access;
  undefined1 local_88 [16];
  _Manager_type local_78;
  code *pcStack_70;
  
  access = get_memory_access(opcode.family);
  __return_storage_ptr__->continue_ = true;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ::_M_initialize_map(&(__return_storage_ptr__->steps_).
                       super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
                      ,0);
  create_addressing_steps((Pipeline *)local_88,this,opcode.address_mode,access);
  Pipeline::append(__return_storage_ptr__,(Pipeline *)local_88);
  std::
  deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ::~deque((deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
            *)(local_88 + 8));
  local_88._8_8_ = (_Map_pointer)0x0;
  pcStack_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1012:17)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1012:17)>
             ::_M_manager;
  local_88._0_8_ = this;
  Pipeline::push(__return_storage_ptr__,(StepT *)local_88);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_sre_instruction(Opcode opcode) {
    const MemoryAccess memory_access = get_memory_access(opcode.family);
    Pipeline result;
    result.append(create_addressing_steps(opcode.address_mode, memory_access));

    // SRE = LSR + EOR
    result.push([this] {
        // LSR
        const uint8_t shifted_value = tmp_ >> 1u;
        set_carry(tmp_ & 0x01u);
        mmu_->write_byte(effective_address_, shifted_value);

        // EOR
        registers_->a ^= shifted_value;
        set_zero(registers_->a);
        set_negative(registers_->a);
    });

    return result;
}